

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmodule.cpp
# Opt level: O2

Ref __thiscall trun::TestModule::ExecuteExit(TestModule *this,Ref *dynlib)

{
  element_type *dynlib_00;
  Config *pCVar1;
  ResultSummary *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Ref RVar3;
  __shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> local_60;
  CBPrePostHook local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined8 local_40;
  CBPrePostHook local_38;
  
  _Var2._M_pi = in_RDX;
  if (dynlib[9].super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pCVar1 = Config::Instance();
    _Var2._M_pi = extraout_RDX;
    if (pCVar1->testModuleGlobals != false) {
      dynlib_00 = ((__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)(dynlib + 9))->_M_ptr
      ;
      std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *)&local_50,
                 (__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *)in_RDX);
      local_38.cbHookV1 = (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0;
      local_40 = 0;
      TestFunc::Execute((TestFunc *)this,(Ref *)dynlib_00,&local_50,&local_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
      _Var2._M_pi = extraout_RDX_00;
      if (this->_vptr_TestModule != (_func_int **)0x0) {
        this_00 = ResultSummary::Instance();
        std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,
                   (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)(dynlib + 9));
        ResultSummary::AddResult(this_00,(Ref *)&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        _Var2._M_pi = extraout_RDX_01;
      }
      goto LAB_0010e62d;
    }
  }
  this->_vptr_TestModule = (_func_int **)0x0;
  *(undefined8 *)&this->state = 0;
LAB_0010e62d:
  RVar3.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  RVar3.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref)RVar3.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestResult::Ref TestModule::ExecuteExit(const IDynLibrary::Ref &dynlib) {
    if (exitFunc == nullptr) return nullptr;
    if (!Config::Instance().testModuleGlobals) return nullptr;

    auto testResult = exitFunc->Execute(dynlib, {}, {});

    if (testResult != nullptr) {
        ResultSummary::Instance().AddResult(exitFunc);
    }
    return testResult;
}